

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O2

void EndVisitCatch(ParseNode *pnode,ByteCodeGenerator *byteCodeGenerator)

{
  Scope *pSVar1;
  FuncInfo *this;
  code *pcVar2;
  bool bVar3;
  ParseNodeCatch *pPVar4;
  undefined4 *puVar5;
  
  pPVar4 = ParseNode::AsParseNodeCatch(pnode);
  pSVar1 = pPVar4->scope;
  if (pSVar1->innerScopeIndex != 0xffffffff) {
    this = pSVar1->func;
    bVar3 = ByteCodeGenerator::IsInDebugMode(byteCodeGenerator);
    if (!bVar3) {
      bVar3 = Js::FunctionProxy::IsCoroutine(&this->byteCodeFunction->super_FunctionProxy);
      if (!bVar3) {
        if (pSVar1->innerScopeIndex != this->currentInnerScopeIndex) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar5 = 1;
          bVar3 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                             ,0xa6,"(scope->GetInnerScopeIndex() == func->CurrentInnerScopeIndex())"
                             ,"scope->GetInnerScopeIndex() == func->CurrentInnerScopeIndex()");
          if (!bVar3) {
            pcVar2 = (code *)invalidInstructionException();
            (*pcVar2)();
          }
          *puVar5 = 0;
        }
        FuncInfo::ReleaseInnerScopeIndex(this);
      }
    }
  }
  ByteCodeGenerator::PopScope(byteCodeGenerator);
  return;
}

Assistant:

void EndVisitCatch(ParseNode *pnode, ByteCodeGenerator *byteCodeGenerator)
{
    Scope *scope = pnode->AsParseNodeCatch()->scope;
    FuncInfo *func = scope->GetFunc();

    if (scope->HasInnerScopeIndex() && !(byteCodeGenerator->IsInDebugMode() || func->byteCodeFunction->IsCoroutine()))
    {
        // In debug mode (or for the generator/async function), don't release the current index, as we're giving each scope a unique index,
        // regardless of nesting.

        Assert(scope->GetInnerScopeIndex() == func->CurrentInnerScopeIndex());
        func->ReleaseInnerScopeIndex();
    }

    byteCodeGenerator->PopScope();
}